

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p,uchar *tweak32)

{
  int iVar1;
  int iVar2;
  secp256k1_scalar term;
  int overflow;
  secp256k1_gej local_a8;
  
  overflow = 0;
  secp256k1_scalar_set_b32(&term,tweak32,&overflow);
  iVar2 = 0;
  if (overflow == 0) {
    secp256k1_gej_set_ge(&local_a8,p);
    secp256k1_ecmult(&local_a8,&local_a8,&secp256k1_scalar_one,&term);
    iVar1 = secp256k1_gej_is_infinity(&local_a8);
    iVar2 = 0;
    if (iVar1 == 0) {
      secp256k1_ge_set_gej(p,&local_a8);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(p, &term);
}